

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate.cc
# Opt level: O0

Validity __thiscall bssl::Certificate::GetValidity(Certificate *this)

{
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var1;
  element_type *peVar2;
  ParsedTbsCertificate *pPVar3;
  Certificate *this_local;
  Validity validity;
  
  p_Var1 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)::std::
              unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
              ::operator->(&this->internals_);
  peVar2 = ::std::
           __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  pPVar3 = ParsedCertificate::tbs(peVar2);
  bssl::der::GeneralizedTimeToPosixTime(&pPVar3->validity_not_before,(int64_t *)&this_local);
  p_Var1 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)::std::
              unique_ptr<bssl::CertificateInternals,_std::default_delete<bssl::CertificateInternals>_>
              ::operator->(&this->internals_);
  peVar2 = ::std::
           __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  pPVar3 = ParsedCertificate::tbs(peVar2);
  bssl::der::GeneralizedTimeToPosixTime(&pPVar3->validity_not_after,&validity.not_before);
  return _this_local;
}

Assistant:

Certificate::Validity Certificate::GetValidity() const {
  Certificate::Validity validity;

  // As this is a previously parsed certificate, we know the not_before
  // and not after are valid, so these conversions can not fail.
  (void) GeneralizedTimeToPosixTime(
      internals_->cert->tbs().validity_not_before, &validity.not_before);
  (void) GeneralizedTimeToPosixTime(
      internals_->cert->tbs().validity_not_after, &validity.not_after);
  return validity;
}